

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O1

void __thiscall
soplex::
LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::add(LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      *this,DataKey *newkey,
     number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *obj,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *newlower,
     SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
     *newcolVector,
     number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
     *newupper,int *newscaleExp)

{
  int iVar1;
  pointer pnVar2;
  int32_t iVar3;
  long lVar4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar5;
  pointer pnVar6;
  byte bVar7;
  
  bVar7 = 0;
  SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,newkey,newcolVector);
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  if ((int)((ulong)((long)(this->low).val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->low).val.
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 7) < iVar1) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->low,iVar1,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->up,
            (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum,true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->object,
            (this->
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).set.thenum,true);
    DataArray<int>::reSize
              (&this->scaleExp,
               (this->
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).set.thenum);
  }
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->low).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = newlower;
  pnVar6 = pnVar2 + (long)iVar1 + -1;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  pnVar2[(long)iVar1 + -1].m_backend.exp = (newlower->m_backend).exp;
  pnVar2[(long)iVar1 + -1].m_backend.neg = (newlower->m_backend).neg;
  iVar3 = (newlower->m_backend).prec_elem;
  pnVar2[(long)iVar1 + -1].m_backend.fpclass = (newlower->m_backend).fpclass;
  pnVar2[(long)iVar1 + -1].m_backend.prec_elem = iVar3;
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->up).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = newupper;
  pnVar6 = pnVar2 + (long)iVar1 + -1;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  pnVar2[(long)iVar1 + -1].m_backend.exp = (newupper->m_backend).exp;
  pnVar2[(long)iVar1 + -1].m_backend.neg = (newupper->m_backend).neg;
  iVar3 = (newupper->m_backend).prec_elem;
  pnVar2[(long)iVar1 + -1].m_backend.fpclass = (newupper->m_backend).fpclass;
  pnVar2[(long)iVar1 + -1].m_backend.prec_elem = iVar3;
  iVar1 = (this->
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).set.thenum;
  pnVar2 = (this->object).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar5 = obj;
  pnVar6 = pnVar2 + (long)iVar1 + -1;
  for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pnVar6->m_backend).data._M_elems[0] = (pnVar5->m_backend).data._M_elems[0];
    pnVar5 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar5 + ((ulong)bVar7 * -2 + 1) * 4);
    pnVar6 = (pointer)((long)pnVar6 + ((ulong)bVar7 * -2 + 1) * 4);
  }
  pnVar2[(long)iVar1 + -1].m_backend.exp = (obj->m_backend).exp;
  pnVar2[(long)iVar1 + -1].m_backend.neg = (obj->m_backend).neg;
  iVar3 = (obj->m_backend).prec_elem;
  pnVar2[(long)iVar1 + -1].m_backend.fpclass = (obj->m_backend).fpclass;
  pnVar2[(long)iVar1 + -1].m_backend.prec_elem = iVar3;
  (this->scaleExp).data
  [(long)(this->
         super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).set.thenum + -1] = *newscaleExp;
  return;
}

Assistant:

void add(DataKey& newkey, const R& obj, const R& newlower, const SVectorBase<R>& newcolVector,
            const R& newupper, const int& newscaleExp = 0)
   {
      SVSetBase<R>::add(newkey, newcolVector);

      if(num() > low.dim())
      {
         low.reDim(num());
         up.reDim(num());
         object.reDim(num());
         scaleExp.reSize(num());
      }

      low[num() - 1] = newlower;
      up[num() - 1] = newupper;
      object[num() - 1] = obj;
      scaleExp[num() - 1] = newscaleExp;
   }